

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_strand_array.h
# Opt level: O3

Split * __thiscall
embree::sse2::HeuristicStrandSplit::find
          (Split *__return_storage_ptr__,HeuristicStrandSplit *this,range<unsigned_long> *set,
          size_t logBlockSize)

{
  uint uVar1;
  uint uVar2;
  Geometry *pGVar3;
  PrimRef *pPVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  ulong uVar12;
  unsigned_long uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar20;
  undefined1 auVar19 [16];
  float fVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar31;
  undefined1 auVar32 [12];
  vfloat4 a_1;
  float fVar35;
  float fVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar37;
  float fVar38;
  vfloat4 a;
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  vfloat4 a0;
  vfloat4 a0_1;
  LinearSpace3fa space0;
  LinearSpace3fa space1;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138 [8];
  undefined8 uStack_130;
  undefined1 local_128 [8];
  undefined8 uStack_120;
  long local_110;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  undefined1 local_e8 [8];
  undefined8 uStack_e0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar13 = set->_begin;
  uVar17 = set->_end;
  if (uVar13 < uVar17) {
    uVar12 = uVar13 << 5 | 0x1c;
    local_148 = 0;
    uStack_140 = 0x3f800000;
    uVar16 = 0xffffffffffffffff;
    do {
      uVar1 = *(uint *)((long)this->prims + (uVar12 - 0x10));
      uVar15 = CONCAT44(*(undefined4 *)((long)&(this->prims->lower).field_0 + uVar12),uVar1);
      if (uVar15 < uVar16) {
        (*(((this->scene->geometries).items[uVar1].ptr)->super_RefCount)._vptr_RefCount[0x37])
                  (local_98);
        fVar28 = (float)local_98._4_4_ * (float)local_98._4_4_;
        fVar29 = fStack_90 * fStack_90;
        fVar30 = fStack_8c * fStack_8c;
        fVar21 = fVar28 + (float)local_98._0_4_ * (float)local_98._0_4_ + fVar29;
        auVar26._0_8_ = CONCAT44(fVar28 + fVar28 + fVar30,fVar21);
        auVar26._8_4_ = fVar28 + fVar29 + fVar29;
        auVar26._12_4_ = fVar28 + fVar30 + fVar30;
        if (1e-18 < fVar21) {
          auVar25._8_4_ = auVar26._8_4_;
          auVar25._0_8_ = auVar26._0_8_;
          auVar25._12_4_ = auVar26._12_4_;
          auVar26 = rsqrtss(auVar25,auVar26);
          fVar28 = auVar26._0_4_;
          fVar21 = fVar28 * fVar28 * fVar21 * -0.5 * fVar28 + fVar28 * 1.5;
          local_148 = CONCAT44((float)local_98._4_4_ * fVar21,(float)local_98._0_4_ * fVar21);
          uStack_140 = CONCAT44(fStack_8c * fVar21,fStack_90 * fVar21);
          uVar16 = uVar15;
        }
        uVar17 = set->_end;
      }
      uVar13 = uVar13 + 1;
      uVar12 = uVar12 + 0x20;
    } while (uVar13 < uVar17);
    uVar13 = set->_begin;
    uVar18 = local_148;
    uVar20 = uStack_140;
  }
  else {
    uVar18 = 0;
    uVar20 = 0x3f800000;
  }
  uStack_120 = uVar20;
  local_128 = (undefined1  [8])uVar18;
  uStack_140._0_4_ = (float)uVar20;
  local_148._0_4_ = (float)uVar18;
  local_148._4_4_ = (float)((ulong)uVar18 >> 0x20);
  if (uVar13 < uVar17) {
    uVar16 = uVar13 << 5 | 0x1c;
    local_138._0_4_ = 1.0;
    uVar17 = 0xffffffffffffffff;
    do {
      uVar1 = *(uint *)((long)this->prims + (uVar16 - 0x10));
      uVar2 = *(uint *)((long)&(this->prims->lower).field_0 + uVar16);
      pGVar3 = (this->scene->geometries).items[uVar1].ptr;
      (*(pGVar3->super_RefCount)._vptr_RefCount[0x37])(local_98,pGVar3,(ulong)uVar2);
      auVar23._0_4_ =
           SQRT(local_98._8_4_ * local_98._8_4_ +
                local_98._4_4_ * local_98._4_4_ + local_98._0_4_ * local_98._0_4_);
      if ((auVar23._0_4_ != 0.0) || (NAN(auVar23._0_4_))) {
        uVar12 = CONCAT44(uVar2,uVar1);
        auVar23._4_4_ = auVar23._0_4_;
        auVar23._8_4_ = auVar23._0_4_;
        auVar23._12_4_ = auVar23._0_4_;
        auVar26 = divps(_local_98,auVar23);
        fVar21 = ABS((float)uStack_140 * auVar26._8_4_ +
                     local_148._4_4_ * auVar26._4_4_ + (float)local_148 * auVar26._0_4_);
        if ((fVar21 < (float)local_138._0_4_) ||
           (fVar21 == (float)local_138._0_4_ && uVar12 < uVar17)) {
          uVar17 = uVar12;
          _local_128 = auVar26;
          local_138._0_4_ = fVar21;
        }
      }
      uVar13 = uVar13 + 1;
      uVar16 = uVar16 + 0x20;
    } while (uVar13 < set->_end);
  }
  fVar28 = -local_148._4_4_;
  fVar21 = -(float)uStack_140;
  auVar22._8_4_ = 0xffffffff;
  auVar22._0_8_ = 0xffffffffffffffff;
  auVar32._8_4_ = 0xffffffff;
  auVar32._0_8_ = 0xffffffffffffffff;
  if (fVar28 * fVar28 + (float)uStack_140 * (float)uStack_140 + 0.0 <=
      (float)local_148 * (float)local_148 + fVar21 * fVar21 + 0.0) {
    auVar32 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar29 = (float)((uint)(float)uStack_140 & auVar32._4_4_);
  fVar21 = (float)(~auVar32._0_4_ & (uint)fVar21);
  fVar31 = (float)(~auVar32._8_4_ & (uint)(float)local_148 | (uint)fVar28 & auVar32._8_4_);
  fVar28 = fVar29 * fVar29;
  fVar30 = fVar31 * fVar31;
  fVar37 = fVar28 + fVar21 * fVar21 + fVar30;
  fVar38 = fVar28 + fVar28 + 0.0;
  fVar30 = fVar28 + fVar30 + fVar30;
  fVar28 = fVar28 + 0.0 + 0.0;
  auVar39._4_4_ = fVar38;
  auVar39._0_4_ = fVar37;
  auVar39._8_4_ = fVar30;
  auVar39._12_4_ = fVar28;
  auVar6._4_4_ = fVar38;
  auVar6._0_4_ = fVar37;
  auVar6._8_4_ = fVar30;
  auVar6._12_4_ = fVar28;
  auVar26 = rsqrtss(auVar39,auVar6);
  fVar28 = auVar26._0_4_;
  fVar28 = fVar28 * 1.5 - fVar28 * fVar28 * fVar37 * 0.5 * fVar28;
  fVar21 = fVar28 * fVar21;
  fVar29 = fVar28 * fVar29;
  fVar31 = fVar28 * fVar31;
  uStack_140._4_4_ = (float)((ulong)uVar20 >> 0x20);
  fVar30 = fVar29 * (float)local_148 - local_148._4_4_ * fVar21;
  fVar37 = fVar31 * local_148._4_4_ - (float)uStack_140 * fVar29;
  fVar38 = fVar21 * (float)uStack_140 - (float)local_148 * fVar31;
  fVar36 = fVar28 * 0.0 * uStack_140._4_4_ - uStack_140._4_4_ * fVar28 * 0.0;
  fVar28 = fVar37 * fVar37;
  fVar35 = fVar38 * fVar38;
  fVar36 = fVar36 * fVar36;
  fVar40 = fVar35 + fVar28 + fVar30 * fVar30;
  fVar41 = fVar36 + fVar28 + fVar28;
  fVar35 = fVar35 + fVar28 + fVar35;
  fVar36 = fVar36 + fVar28 + fVar36;
  auVar33._4_4_ = fVar41;
  auVar33._0_4_ = fVar40;
  auVar33._8_4_ = fVar35;
  auVar33._12_4_ = fVar36;
  auVar8._4_4_ = fVar41;
  auVar8._0_4_ = fVar40;
  auVar8._8_4_ = fVar35;
  auVar8._12_4_ = fVar36;
  auVar26 = rsqrtss(auVar33,auVar8);
  fVar28 = auVar26._0_4_;
  fVar28 = fVar28 * 1.5 - fVar28 * fVar28 * fVar40 * 0.5 * fVar28;
  local_98._4_4_ = fVar28 * fVar37;
  local_98._0_4_ = fVar21;
  fStack_90 = (float)local_148;
  fStack_8c = 0.0;
  local_88._4_4_ = fVar28 * fVar38;
  local_88._0_4_ = fVar29;
  local_88._8_4_ = local_148._4_4_;
  local_88._12_4_ = 0;
  local_78._4_4_ = fVar28 * fVar30;
  local_78._0_4_ = fVar31;
  local_78._8_4_ = (float)uStack_140;
  local_78._12_4_ = 0;
  fVar28 = -(float)local_128._4_4_;
  fVar21 = -(float)uStack_120;
  if (fVar28 * fVar28 + (float)uStack_120 * (float)uStack_120 + 0.0 <=
      (float)local_128._0_4_ * (float)local_128._0_4_ + fVar21 * fVar21 + 0.0) {
    auVar22 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar36 = (float)((uint)(float)uStack_120 & auVar22._4_4_);
  fVar21 = (float)(~auVar22._0_4_ & (uint)fVar21);
  fVar31 = (float)(~auVar22._8_4_ & local_128._0_4_ | (uint)fVar28 & auVar22._8_4_);
  fVar28 = fVar36 * fVar36;
  fVar29 = fVar31 * fVar31;
  fVar30 = fVar28 + fVar21 * fVar21 + fVar29;
  fVar37 = fVar28 + fVar28 + 0.0;
  fVar29 = fVar28 + fVar29 + fVar29;
  fVar28 = fVar28 + 0.0 + 0.0;
  auVar34._4_4_ = fVar37;
  auVar34._0_4_ = fVar30;
  auVar34._8_4_ = fVar29;
  auVar34._12_4_ = fVar28;
  auVar5._4_4_ = fVar37;
  auVar5._0_4_ = fVar30;
  auVar5._8_4_ = fVar29;
  auVar5._12_4_ = fVar28;
  auVar26 = rsqrtss(auVar34,auVar5);
  fVar28 = auVar26._0_4_;
  fVar29 = fVar28 * 1.5 - fVar28 * fVar28 * fVar30 * 0.5 * fVar28;
  fVar21 = fVar29 * fVar21;
  fVar36 = fVar29 * fVar36;
  fVar31 = fVar29 * fVar31;
  fVar28 = fVar36 * (float)local_128._0_4_ - (float)local_128._4_4_ * fVar21;
  fVar30 = fVar31 * (float)local_128._4_4_ - (float)uStack_120 * fVar36;
  fVar37 = fVar21 * (float)uStack_120 - (float)local_128._0_4_ * fVar31;
  fVar35 = fVar29 * 0.0 * uStack_120._4_4_ - uStack_120._4_4_ * fVar29 * 0.0;
  fVar29 = fVar30 * fVar30;
  fVar38 = fVar37 * fVar37;
  fVar35 = fVar35 * fVar35;
  fVar40 = fVar38 + fVar29 + fVar28 * fVar28;
  fVar41 = fVar35 + fVar29 + fVar29;
  fVar38 = fVar38 + fVar29 + fVar38;
  fVar35 = fVar35 + fVar29 + fVar35;
  auVar24._4_4_ = fVar41;
  auVar24._0_4_ = fVar40;
  auVar24._8_4_ = fVar38;
  auVar24._12_4_ = fVar35;
  auVar7._4_4_ = fVar41;
  auVar7._0_4_ = fVar40;
  auVar7._8_4_ = fVar38;
  auVar7._12_4_ = fVar35;
  auVar26 = rsqrtss(auVar24,auVar7);
  fVar29 = auVar26._0_4_;
  fVar29 = fVar29 * 1.5 - fVar29 * fVar29 * fVar40 * 0.5 * fVar29;
  local_68._4_4_ = fVar29 * fVar30;
  local_68._0_4_ = fVar21;
  local_68._8_4_ = local_128._0_4_;
  local_68._12_4_ = 0;
  local_58._4_4_ = fVar29 * fVar37;
  local_58._0_4_ = fVar36;
  local_58._8_4_ = local_128._4_4_;
  local_58._12_4_ = 0;
  local_48._4_4_ = fVar29 * fVar28;
  local_48._0_4_ = fVar31;
  local_48._8_4_ = (float)uStack_120;
  local_48._12_4_ = 0;
  uVar17 = set->_begin;
  fVar21 = INFINITY;
  if (uVar17 < set->_end) {
    uVar16 = uVar17 << 5 | 0x1c;
    local_110 = 0;
    lVar14 = 0;
    uStack_f0 = 0xff800000ff800000;
    local_f8 = (undefined1  [8])0xff800000ff800000;
    uStack_130 = 0xff800000ff800000;
    local_138 = (undefined1  [8])0xff800000ff800000;
    uStack_100 = 0x7f8000007f800000;
    local_108 = (undefined1  [8])0x7f8000007f800000;
    uStack_e0 = 0x7f8000007f800000;
    local_e8 = (undefined1  [8])0x7f8000007f800000;
    do {
      pPVar4 = this->prims;
      pGVar3 = (this->scene->geometries).items[*(uint *)((long)pPVar4 + (uVar16 - 0x10))].ptr;
      (*(pGVar3->super_RefCount)._vptr_RefCount[0x37])
                (&local_b8,pGVar3,(ulong)*(uint *)((long)&(pPVar4->lower).field_0 + uVar16));
      fVar21 = fStack_b4 * fStack_b4;
      fVar28 = fStack_b0 * fStack_b0;
      fVar29 = fStack_ac * fStack_ac;
      fVar30 = fVar21 + local_b8 * local_b8 + fVar28;
      auVar27._0_8_ = CONCAT44(fVar21 + fVar21 + fVar29,fVar30);
      auVar27._8_4_ = fVar21 + fVar28 + fVar28;
      auVar27._12_4_ = fVar21 + fVar29 + fVar29;
      auVar19._8_4_ = auVar27._8_4_;
      auVar19._0_8_ = auVar27._0_8_;
      auVar19._12_4_ = auVar27._12_4_;
      auVar26 = rsqrtss(auVar19,auVar27);
      fVar21 = auVar26._0_4_;
      fVar21 = fVar21 * fVar21 * fVar30 * -0.5 * fVar21 + fVar21 * 1.5;
      if (ABS((float)uStack_140 * fVar21 * fStack_b0 +
              local_148._4_4_ * fVar21 * fStack_b4 + (float)local_148 * fVar21 * local_b8) <=
          ABS(fVar21 * fStack_b0 * (float)uStack_120 +
              fVar21 * fStack_b4 * (float)local_128._4_4_ +
              fVar21 * local_b8 * (float)local_128._0_4_)) {
        lVar14 = lVar14 + 1;
        pGVar3 = (this->scene->geometries).items[*(uint *)((long)pPVar4 + (uVar16 - 0x10))].ptr;
        (*(pGVar3->super_RefCount)._vptr_RefCount[0x3a])
                  (&local_b8,pGVar3,local_68,
                   (ulong)*(uint *)((long)&(pPVar4->lower).field_0 + uVar16));
        auVar10._4_4_ = fStack_b4;
        auVar10._0_4_ = local_b8;
        auVar10._8_4_ = fStack_b0;
        auVar10._12_4_ = fStack_ac;
        _local_e8 = minps(_local_e8,auVar10);
        _local_138 = maxps(_local_138,local_a8);
      }
      else {
        local_110 = local_110 + 1;
        pGVar3 = (this->scene->geometries).items[*(uint *)((long)pPVar4 + (uVar16 - 0x10))].ptr;
        (*(pGVar3->super_RefCount)._vptr_RefCount[0x3a])
                  (&local_b8,pGVar3,local_98,
                   (ulong)*(uint *)((long)&(pPVar4->lower).field_0 + uVar16));
        auVar9._4_4_ = fStack_b4;
        auVar9._0_4_ = local_b8;
        auVar9._8_4_ = fStack_b0;
        auVar9._12_4_ = fStack_ac;
        _local_108 = minps(_local_108,auVar9);
        _local_f8 = maxps(_local_f8,local_a8);
      }
      uVar17 = uVar17 + 1;
      uVar16 = uVar16 + 0x20;
    } while (uVar17 < set->_end);
    fVar21 = INFINITY;
    if (lVar14 != 0 && local_110 != 0) {
      bVar11 = (byte)logBlockSize;
      uVar17 = ~(-1L << (bVar11 & 0x3f));
      fVar21 = (float)(local_110 + uVar17 >> (bVar11 & 0x3f)) *
               ((((float)local_f8._4_4_ - (float)local_108._4_4_) +
                ((float)uStack_f0 - (float)uStack_100)) *
                ((float)local_f8._0_4_ - (float)local_108._0_4_) +
               ((float)uStack_f0 - (float)uStack_100) *
               ((float)local_f8._4_4_ - (float)local_108._4_4_)) +
               ((((float)local_138._4_4_ - (float)local_e8._4_4_) +
                ((float)uStack_130 - (float)uStack_e0)) *
                ((float)local_138._0_4_ - (float)local_e8._0_4_) +
               ((float)uStack_130 - (float)uStack_e0) *
               ((float)local_138._4_4_ - (float)local_e8._4_4_)) *
               (float)(lVar14 + uVar17 >> (bVar11 & 0x3f));
    }
  }
  __return_storage_ptr__->sah = fVar21;
  *(undefined8 *)&(__return_storage_ptr__->axis0).field_0 = uVar18;
  *(undefined8 *)((long)&(__return_storage_ptr__->axis0).field_0 + 8) = uVar20;
  *(undefined1 (*) [8])&(__return_storage_ptr__->axis1).field_0 = local_128;
  *(undefined8 *)((long)&(__return_storage_ptr__->axis1).field_0 + 8) = uStack_120;
  return __return_storage_ptr__;
}

Assistant:

const Split find(const range<size_t>& set, size_t logBlockSize)
      {
        Vec3fa axis0(0,0,1);
        uint64_t bestGeomPrimID = -1;

        /* curve with minimum ID determines first axis */
        for (size_t i=set.begin(); i<set.end(); i++)
        {
          const uint64_t geomprimID = prims[i].ID64();
          if (geomprimID >= bestGeomPrimID) continue;
          const Vec3fa axis = direction(prims[i]);
          if (sqr_length(axis) > 1E-18f) {
            axis0 = normalize(axis);
            bestGeomPrimID = geomprimID;
          }
        }
      
        /* find 2nd axis that is most misaligned with first axis and has minimum ID */
        float bestCos = 1.0f;
        Vec3fa axis1 = axis0;
        bestGeomPrimID = -1;
        for (size_t i=set.begin(); i<set.end(); i++) 
        {
          const uint64_t geomprimID = prims[i].ID64();
          Vec3fa axisi = direction(prims[i]);
          float leni = length(axisi);
          if (leni == 0.0f) continue;
          axisi /= leni;
          float cos = abs(dot(axisi,axis0));
          if ((cos == bestCos && (geomprimID < bestGeomPrimID)) || cos < bestCos) {
            bestCos = cos; axis1 = axisi;
            bestGeomPrimID = geomprimID;
          }
        }
      
        /* partition the two strands */
        size_t lnum = 0, rnum = 0;
        BBox3fa lbounds = empty, rbounds = empty;
        const LinearSpace3fa space0 = frame(axis0).transposed();
        const LinearSpace3fa space1 = frame(axis1).transposed();
        
        for (size_t i=set.begin(); i<set.end(); i++)
        {
          PrimRef& prim = prims[i];
          const Vec3fa axisi = normalize(direction(prim));
          const float cos0 = abs(dot(axisi,axis0));
          const float cos1 = abs(dot(axisi,axis1));
          
          if (cos0 > cos1) { lnum++; lbounds.extend(bounds(space0,prim)); }
          else             { rnum++; rbounds.extend(bounds(space1,prim)); }
        }
      
        /*! return an invalid split if we do not partition */
        if (lnum == 0 || rnum == 0) 
          return Split(inf,axis0,axis1);
      
        /*! calculate sah for the split */
        const size_t lblocks = (lnum+(1ull<<logBlockSize)-1ull) >> logBlockSize;
        const size_t rblocks = (rnum+(1ull<<logBlockSize)-1ull) >> logBlockSize;
        const float sah = madd(float(lblocks),halfArea(lbounds),float(rblocks)*halfArea(rbounds));
        return Split(sah,axis0,axis1);
      }